

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

bool __thiscall ON_BoundingBox::GetCorners(ON_BoundingBox *this,ON_3dPoint *corners)

{
  bool bVar1;
  ON_3dPoint *pOVar2;
  double local_68;
  double local_60;
  double local_58;
  int local_44;
  int local_40;
  int k;
  int j;
  int i;
  ON_3dPoint P;
  int n;
  ON_3dPoint *corners_local;
  ON_BoundingBox *this_local;
  
  P.z._4_4_ = 0;
  bVar1 = IsValid(this);
  if (bVar1) {
    for (k = 0; k < 2; k = k + 1) {
      if (k == 0) {
        local_58 = (this->m_min).x;
      }
      else {
        local_58 = (this->m_max).x;
      }
      for (local_40 = 0; local_40 < 2; local_40 = local_40 + 1) {
        if (local_40 == 0) {
          local_60 = (this->m_min).y;
        }
        else {
          local_60 = (this->m_max).y;
        }
        for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
          if (local_44 == 0) {
            local_68 = (this->m_min).z;
          }
          else {
            local_68 = (this->m_max).z;
          }
          pOVar2 = corners + P.z._4_4_;
          pOVar2->x = local_58;
          pOVar2->y = local_60;
          pOVar2->z = local_68;
          P.z._4_4_ = P.z._4_4_ + 1;
        }
      }
    }
  }
  return P.z._4_4_ == 8;
}

Assistant:

bool
ON_BoundingBox::GetCorners( 
  ON_3dPoint corners[8]// returns list of 8 corner points
  ) const
{
  int n = 0;
  if ( IsValid() ) 
  {
    ON_3dPoint P;
    int i,j,k;
    for( i = 0; i < 2; i++ ) 
    {
      P.x = (i) ? m_max.x : m_min.x;
      for ( j = 0; j < 2; j++ )
      {
        P.y = (j) ? m_max.y : m_min.y;
        for ( k = 0; k < 2; k++ )
        {
          P.z = (k) ? m_max.z : m_min.z;
          corners[n++] = P;
        }
      }
    }
  }
  return (8==n);
}